

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

void __thiscall QSqlTableModel::revertAll(QSqlTableModel *this)

{
  int iVar1;
  qsizetype qVar2;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  int i;
  QSqlTableModelPrivate *d;
  QList<int> rows;
  qsizetype in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  QList<int> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QSqlTableModel *)0x16f11a);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (int *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QMap<int,_QSqlTableModelPrivate::ModifiedRow>::keys
            ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  qVar2 = QList<int>::size(&local_20);
  iVar3 = (int)qVar2;
  while (iVar3 = iVar3 + -1, -1 < iVar3) {
    iVar1 = QList<int>::value(in_RDI,in_stack_ffffffffffffffb8);
    (**(code **)&(in_RDI->d).d[0x1c].super_QArrayData)(in_RDI,iVar1);
  }
  QList<int>::~QList((QList<int> *)0x16f1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlTableModel::revertAll()
{
    Q_D(QSqlTableModel);

    const QList<int> rows(d->cache.keys());
    for (int i = rows.size() - 1; i >= 0; --i)
        revertRow(rows.value(i));
}